

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidateElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr root)

{
  xmlNodePtr pxVar1;
  uint uVar2;
  xmlChar *pxVar3;
  uint uVar4;
  _xmlAttr *attr;
  xmlNs *ns;
  _xmlNode *elem;
  
  if ((doc == (xmlDocPtr)0x0 || root == (xmlNodePtr)0x0) ||
     ((doc->intSubset == (_xmlDtd *)0x0 && (doc->extSubset == (_xmlDtd *)0x0)))) {
    return 0;
  }
  uVar4 = 1;
  pxVar1 = root;
LAB_00159a41:
  elem = pxVar1;
  uVar2 = xmlValidateOneElement(ctxt,doc,elem);
  uVar4 = uVar2 & uVar4;
  if (elem->type == XML_ELEMENT_NODE) goto code_r0x00159a63;
  goto LAB_00159b11;
code_r0x00159a63:
  for (attr = elem->properties; attr != (xmlAttrPtr)0x0; attr = attr->next) {
    if (attr->children == (xmlNode *)0x0) {
      pxVar3 = xmlStrdup("");
    }
    else {
      pxVar3 = xmlNodeListGetString(doc,attr->children,0);
    }
    if (pxVar3 == (xmlChar *)0x0) {
      xmlVErrMemory(ctxt);
      uVar4 = 0;
    }
    else {
      uVar2 = xmlValidateOneAttribute(ctxt,doc,elem,attr,pxVar3);
      uVar4 = uVar4 & uVar2;
      (*xmlFree)(pxVar3);
    }
  }
  for (ns = elem->nsDef; ns != (xmlNsPtr)0x0; ns = ns->next) {
    if (elem->ns == (xmlNs *)0x0) {
      pxVar3 = (xmlChar *)0x0;
    }
    else {
      pxVar3 = elem->ns->prefix;
    }
    uVar2 = xmlValidateOneNamespace(ctxt,doc,elem,pxVar3,ns,ns->href);
    uVar4 = uVar4 & uVar2;
  }
  pxVar1 = elem->children;
  if (elem->children == (_xmlNode *)0x0) {
LAB_00159b11:
    while( true ) {
      if (elem == root) {
        return uVar4;
      }
      pxVar1 = elem->next;
      if (elem->next != (_xmlNode *)0x0) break;
      elem = elem->parent;
    }
  }
  goto LAB_00159a41;
}

Assistant:

int
xmlValidateElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc, xmlNodePtr root) {
    xmlNodePtr elem;
    xmlAttrPtr attr;
    xmlNsPtr ns;
    const xmlChar *value;
    int ret = 1;

    if (root == NULL) return(0);

    CHECK_DTD;

    elem = root;
    while (1) {
        ret &= xmlValidateOneElement(ctxt, doc, elem);

        if (elem->type == XML_ELEMENT_NODE) {
            attr = elem->properties;
            while (attr != NULL) {
                if (attr->children == NULL)
                    value = xmlStrdup(BAD_CAST "");
                else
                    value = xmlNodeListGetString(doc, attr->children, 0);
                if (value == NULL) {
                    xmlVErrMemory(ctxt);
                    ret = 0;
                } else {
                    ret &= xmlValidateOneAttribute(ctxt, doc, elem, attr, value);
                    xmlFree((char *)value);
                }
                attr= attr->next;
            }

            ns = elem->nsDef;
            while (ns != NULL) {
                if (elem->ns == NULL)
                    ret &= xmlValidateOneNamespace(ctxt, doc, elem, NULL,
                                                   ns, ns->href);
                else
                    ret &= xmlValidateOneNamespace(ctxt, doc, elem,
                                                   elem->ns->prefix, ns,
                                                   ns->href);
                ns = ns->next;
            }

            if (elem->children != NULL) {
                elem = elem->children;
                continue;
            }
        }

        while (1) {
            if (elem == root)
                goto done;
            if (elem->next != NULL)
                break;
            elem = elem->parent;
        }
        elem = elem->next;
    }

done:
    return(ret);
}